

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O3

bool __thiscall Datetime::parse_time_utc(Datetime *this,Pig *pig)

{
  bool bVar1;
  uint c;
  size_type previous;
  
  previous = Pig::cursor(pig);
  bVar1 = parse_time(this,pig,false);
  if ((bVar1) && (bVar1 = Pig::skip(pig,0x5a), bVar1)) {
    this->_utc = true;
    c = Pig::peek(pig);
    bVar1 = unicodeLatinDigit(c);
    if (!bVar1) {
      return true;
    }
  }
  Pig::restoreTo(pig,previous);
  return false;
}

Assistant:

bool Datetime::parse_time_utc (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  if (parse_time (pig, false) &&
      pig.skip ('Z'))
  {
    _utc = true;
    if (! unicodeLatinDigit (pig.peek ()))
      return true;
  }

  pig.restoreTo (checkpoint);
  return false;
}